

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O2

void __thiscall GrpLexer::mLIT_UHEX(GrpLexer *this,bool _createToken)

{
  size_type sVar1;
  bool bVar2;
  int el;
  Token *pTVar3;
  ScannerException *this_00;
  char *__rhs;
  Token *pTVar4;
  int iVar5;
  allocator local_81;
  RefToken _token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  _token.ref = (Ref *)0x0;
  sVar1 = (this->super_CharScanner).text._M_string_length;
  std::__cxx11::string::string((string *)&local_78,"U+",(allocator *)&local_50);
  local_58 = sVar1;
  (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x17])(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  iVar5 = 0;
  while( true ) {
    el = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x12])(this,1);
    bVar2 = BitSet::member(&_tokenSet_3,el);
    if (!bVar2) break;
    mXDIGIT(this,false);
    iVar5 = iVar5 + -1;
  }
  if (iVar5 != 0) {
    if (_createToken) {
      if (_token.ref == (Ref *)0x0) {
        pTVar3 = (Token *)0x0;
      }
      else {
        pTVar3 = (_token.ref)->ptr;
      }
      if (nullToken.ref == (Ref *)0x0) {
        pTVar4 = (Token *)0x0;
      }
      else {
        pTVar4 = (nullToken.ref)->ptr;
      }
      if (pTVar3 == pTVar4) {
        (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x13])(&local_78,this,0x1b);
        RefCount<Token>::operator=(&_token,(RefCount<Token> *)&local_78);
        RefCount<Token>::~RefCount((RefCount<Token> *)&local_78);
        if (_token.ref == (Ref *)0x0) {
          pTVar3 = (Token *)0x0;
        }
        else {
          pTVar3 = (_token.ref)->ptr;
        }
        std::__cxx11::string::substr((ulong)&local_78,(ulong)&(this->super_CharScanner).text);
        (*pTVar3->_vptr_Token[6])(pTVar3,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
    RefCount<Token>::operator=(&(this->super_CharScanner)._returnToken,&_token);
    RefCount<Token>::~RefCount(&_token);
    return;
  }
  this_00 = (ScannerException *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_50,"no viable alt for char: ",&local_81);
  iVar5 = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x12])(this,1);
  __rhs = CharScanner::charName(iVar5);
  std::operator+(&local_78,&local_50,__rhs);
  iVar5 = (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0xf])(this);
  ScannerException::ScannerException(this_00,&local_78,iVar5);
  __cxa_throw(this_00,&ScannerException::typeinfo,ANTLRException::~ANTLRException);
}

Assistant:

void GrpLexer::mLIT_UHEX(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = LIT_UHEX;
	
	match("U+");
	{
	int _cnt450=0;
	do {
		if ((_tokenSet_3.member(LA(1)))) {
			mXDIGIT(false);
		}
		else {
			if ( _cnt450>=1 ) { goto _loop450; } else {throw ScannerException(std::string("no viable alt for char: ")+charName(LA(1)),getLine());}
		}
		
		_cnt450++;
	} while (true);
	_loop450:;
	}
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}